

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdCofactoringGetVars(Kit_DsdNtk_t **ppNtk,int nSize,int *pVars)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdNtk_t *pKVar3;
  Kit_DsdObj_t **ppKVar4;
  Kit_DsdObj_t *pKVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Kit_DsdObj_t KVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (nSize < 1) {
    uVar7 = 0;
  }
  else {
    uVar13 = 0;
    uVar7 = 0;
    do {
      pKVar3 = ppNtk[uVar13];
      uVar1 = pKVar3->nNodes;
      if (uVar1 != 0) {
        ppKVar4 = pKVar3->pNodes;
        uVar9 = 0;
        do {
          pKVar5 = ppKVar4[uVar9];
          if (pKVar5 == (Kit_DsdObj_t *)0x0) break;
          KVar10 = *pKVar5;
          if (0x3ffffff < (uint)KVar10 &&
              (((uint)KVar10 & 0xfc000000) != 0xc000000 && ((uint)KVar10 & 0x1c0) == 0x140)) {
            uVar2 = pKVar3->nVars;
            uVar14 = 0;
            do {
              uVar6 = *(ushort *)((long)&pKVar5[1].field_0x0 + uVar14 * 2) >> 1;
              uVar8 = (uint)uVar6;
              if ((uint)uVar2 + (uint)uVar1 <= uVar8) {
                __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                              ,0x9b,"int Kit_DsdLitIsLeaf(Kit_DsdNtk_t *, int)");
              }
              if (uVar6 < uVar2) {
                if ((int)uVar7 < 1) {
                  uVar11 = 0;
LAB_0055d884:
                  if ((uint)uVar11 != uVar7) goto LAB_0055d893;
                }
                else {
                  uVar11 = 0;
                  do {
                    if (pVars[uVar11] == uVar8) goto LAB_0055d884;
                    uVar11 = uVar11 + 1;
                  } while (uVar7 != uVar11);
                }
                lVar12 = (long)(int)uVar7;
                uVar7 = uVar7 + 1;
                pVars[lVar12] = uVar8;
                KVar10 = *pKVar5;
              }
LAB_0055d893:
              uVar14 = uVar14 + 1;
            } while (uVar14 < (uint)KVar10 >> 0x1a);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)uVar1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)nSize);
  }
  return uVar7;
}

Assistant:

int Kit_DsdCofactoringGetVars( Kit_DsdNtk_t ** ppNtk, int nSize, int * pVars )
{
    Kit_DsdObj_t * pObj;
    unsigned m;
    int i, k, v, Var, nVars, iFaninLit;
    // go through all the networks
    nVars = 0;
    for ( i = 0; i < nSize; i++ )
    {
        // go through the prime objects of each networks
        Kit_DsdNtkForEachObj( ppNtk[i], pObj, k )     
        {
            if ( pObj->Type != KIT_DSD_PRIME )
                continue;
            if ( pObj->nFans == 3 )
                continue;
            // collect direct fanin variables
            Kit_DsdObjForEachFanin( ppNtk[i], pObj, iFaninLit, m )
            {
                if ( !Kit_DsdLitIsLeaf(ppNtk[i], iFaninLit) )
                    continue;
                // add it to the array
                Var = Abc_Lit2Var( iFaninLit );
                for ( v = 0; v < nVars; v++ )
                    if ( pVars[v] == Var )
                        break;
                if ( v == nVars )
                    pVars[nVars++] = Var;
            }
        }
    }
    return nVars;
}